

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O1

bool __thiscall GGSock::FileServer::Impl::updateFileInfos(Impl *this)

{
  ulong uVar1;
  mapped_type *pmVar2;
  int iVar3;
  ulong uVar4;
  pointer pFVar5;
  key_type_conflict local_3c;
  TFileInfos *local_38;
  
  local_38 = &this->fileInfos;
  std::
  _Rb_tree<int,_std::pair<const_int,_GGSock::FileServer::FileInfo>,_std::_Select1st<std::pair<const_int,_GGSock::FileServer::FileInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  ::clear(&local_38->_M_t);
  local_3c = 0;
  pFVar5 = (this->files).
           super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->files).
                              super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar5) >> 3) *
          -0x3b13b13b) {
    do {
      uVar1 = (ulong)local_3c;
      uVar4 = uVar1 + 0x3f;
      if (-1 < (long)uVar1) {
        uVar4 = uVar1;
      }
      if (((this->fileUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar4 >> 6) +
            (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar1 & 0x3f) & 1) != 0) {
        pmVar2 = std::
                 map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
                 ::operator[](local_38,&local_3c);
        std::__cxx11::string::_M_assign((string *)pmVar2);
        pmVar2->filesize = pFVar5[uVar1].info.filesize;
        std::__cxx11::string::_M_assign((string *)&pmVar2->filename);
        pmVar2->nChunks = pFVar5[uVar1].info.nChunks;
      }
      local_3c = local_3c + 1;
      pFVar5 = (this->files).
               super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar3 = (int)((ulong)((long)(this->files).
                                  super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar5) >> 3);
    } while (SBORROW4(local_3c,iVar3 * -0x3b13b13b) != local_3c + iVar3 * 0x3b13b13b < 0);
  }
  return true;
}

Assistant:

bool updateFileInfos() {
        fileInfos.clear();

        for (int i = 0; i < (int) files.size(); ++i) {
            if (fileUsed[i] == false) {
                continue;
            }
            const auto & file = files[i];
            fileInfos[i] = file.info;
        }

        return true;
    }